

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::getDataRange_helper<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GLAttributeBuffer *this,
          size_t start,size_t count)

{
  allocator local_39;
  string local_38;
  
  if (((this->super_AttributeBuffer).setFlag != true) ||
     ((ulong)((long)(this->super_AttributeBuffer).arrayCount *
             (this->super_AttributeBuffer).dataSize) < start + count)) {
    std::__cxx11::string::string((string *)&local_38,"bad getData",&local_39);
    exception(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,count,(allocator_type *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> GLAttributeBuffer::getDataRange_helper(size_t start, size_t count) {
  if (!isSet() || start + count > static_cast<size_t>(getDataSize() * getArrayCount())) exception("bad getData");
  bind();
  std::vector<T> readValues(count);
  return readValues;
}